

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

int lj_opt_fwd_tptr(jit_State *J,IRRef lim)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *J_00;
  AliasRet AVar3;
  int iVar4;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar2 = J->chain[0x3b];
  if (lim < uVar2) {
    J_00 = (J->cur).ir;
    do {
      if (uVar1 == J_00[uVar2].field_0.op1) {
        return 0;
      }
      AVar3 = aa_table((jit_State *)&J_00->field_0,(uint)uVar1,(uint)J_00[uVar2].field_0.op1);
      if (AVar3 != ALIAS_NO) {
        return 0;
      }
      uVar2 = *(ushort *)((long)J_00 + (ulong)uVar2 * 8 + 6);
    } while ((ushort)lim < uVar2);
  }
  iVar4 = fwd_aa_tab_clear(J,lim,(uint)uVar1);
  return iVar4;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_tptr(jit_State *J, IRRef lim)
{
  IRRef ta = fins->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > lim) {
    IRIns *newref = IR(ref);
    if (ta == newref->op1 || aa_table(J, ta, newref->op1) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = newref->prev;
  }
  return fwd_aa_tab_clear(J, lim, ta);
}